

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::OnGlobalSet(SharedValidator *this,Location *loc,Var *global_var)

{
  Result RVar1;
  Result RVar2;
  bool bVar3;
  GlobalType global_type;
  GlobalType local_80;
  Var local_78;
  
  local_80.type.enum_ = Any;
  local_80.mutable_ = true;
  Var::Var(&local_78,global_var);
  RVar1 = CheckGlobalIndex(this,&local_78,&local_80);
  bVar3 = RVar1.enum_ == Error;
  Var::~Var(&local_78);
  if (local_80.mutable_ == false) {
    if (global_var->type_ != Index) {
      __assert_fail("is_index()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/ir.h",
                    0x38,"Index wabt::Var::index() const");
    }
    RVar2 = PrintError(this,loc,"can\'t global.set on immutable global at index %u.",
                       (ulong)(global_var->field_2).index_);
    bVar3 = RVar2.enum_ == Error || RVar1.enum_ == Error;
  }
  this->expr_loc_ = loc;
  RVar1 = TypeChecker::OnGlobalSet(&this->typechecker_,local_80.type);
  RVar1.enum_._0_1_ = RVar1.enum_ == Error | bVar3;
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnGlobalSet(const Location& loc, Var global_var) {
  Result result = Result::Ok;
  GlobalType global_type;
  result |= CheckGlobalIndex(global_var, &global_type);
  if (!global_type.mutable_) {
    result |= PrintError(
        loc, "can't global.set on immutable global at index %" PRIindex ".",
        global_var.index());
  }
  expr_loc_ = &loc;
  result |= typechecker_.OnGlobalSet(global_type.type);
  return result;
}